

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BCRec.cpp
# Opt level: O1

ostream * amrex::operator<<(ostream *os,BCRec *b)

{
  ostream *poVar1;
  long lVar2;
  char local_2b [3];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(BCREC ",7);
  lVar2 = -3;
  do {
    poVar1 = (ostream *)std::ostream::operator<<(os,b->bc[lVar2 + 3]);
    local_2b[0] = ':';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2b,1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,b[1].bc[lVar2]);
    local_2b[1] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2b + 1,1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  local_2b[2] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_2b + 2,1);
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os,
            const BCRec&  b)
{
    os << "(BCREC ";
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        os << b.bc[i] << ':' << b.bc[i+AMREX_SPACEDIM] << ' ';
    }
    os << ')';
    return os;
}